

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::CopyTexture
          (DeviceContextVkImpl *this,CopyTextureAttribs *CopyAttribs)

{
  TextureDesc *pTVar1;
  USAGE UVar2;
  USAGE UVar3;
  TextureImplType *pTexture;
  TextureImplType *pTexture_00;
  VkImageAspectFlags VVar4;
  VkImageAspectFlags VVar5;
  Uint64 UVar6;
  TextureFormatAttribs *pTVar7;
  Box *SrcRegion;
  MipLevelProperties MipLevelAttribs;
  Box DstBox;
  Box FullMipBox;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyTexture
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,CopyAttribs);
  pTexture = (TextureImplType *)CopyAttribs->pSrcTexture;
  if (pTexture != (TextureImplType *)0x0) {
    CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTexture);
  }
  pTexture_00 = (TextureImplType *)CopyAttribs->pDstTexture;
  if (pTexture_00 != (TextureImplType *)0x0) {
    CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>((ITexture *)pTexture_00);
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnbindTextureFromFramebuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,true);
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnbindTextureFromFramebuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture_00,true);
  pTVar1 = &(pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc;
  SrcRegion = CopyAttribs->pSrcBox;
  FullMipBox.MinX = 0;
  FullMipBox.MaxX = 0;
  FullMipBox.MinY = 0;
  FullMipBox.MaxY = 0;
  FullMipBox.MinZ = 0;
  FullMipBox.MaxZ = 1;
  if (SrcRegion == (Box *)0x0) {
    GetMipLevelProperties(&MipLevelAttribs,pTVar1,CopyAttribs->SrcMipLevel);
    SrcRegion = &FullMipBox;
    FullMipBox.MaxX = MipLevelAttribs.LogicalWidth;
    FullMipBox.MaxY = MipLevelAttribs.LogicalHeight;
    FullMipBox.MaxZ = MipLevelAttribs.Depth;
  }
  UVar2 = (pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage;
  UVar3 = (pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage;
  if (UVar3 == USAGE_STAGING || UVar2 == USAGE_STAGING) {
    if (UVar2 == USAGE_STAGING && UVar3 != USAGE_STAGING) {
      if (((pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_Desc.CPUAccessFlags & CPU_ACCESS_FLAG_LAST) == CPU_ACCESS_NONE) {
        FormatString<char[88]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [88])
                   "Attempting to copy from staging texture that was not created with CPU_ACCESS_WRITE flag"
                  );
        DebugAssertionFailed
                  ((Char *)MipLevelAttribs._0_8_,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x968);
        if ((Uint32 *)MipLevelAttribs._0_8_ != &MipLevelAttribs.Depth) {
          operator_delete((void *)MipLevelAttribs._0_8_,MipLevelAttribs._16_8_ + 1);
        }
      }
      if ((pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).m_State !=
          RESOURCE_STATE_COPY_SOURCE) {
        FormatString<char[79]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [79])
                   "Source staging texture must permanently be in RESOURCE_STATE_COPY_SOURCE state")
        ;
        DebugAssertionFailed
                  ((Char *)MipLevelAttribs._0_8_,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x969);
        if ((Uint32 *)MipLevelAttribs._0_8_ != &MipLevelAttribs.Depth) {
          operator_delete((void *)MipLevelAttribs._0_8_,MipLevelAttribs._16_8_ + 1);
        }
      }
      UVar6 = GetStagingTextureLocationOffset
                        (pTVar1,CopyAttribs->SrcSlice,CopyAttribs->SrcMipLevel,0x10,SrcRegion->MinX,
                         SrcRegion->MinY,SrcRegion->MinZ);
      GetMipLevelProperties(&MipLevelAttribs,pTVar1,CopyAttribs->SrcMipLevel);
      DstBox.MaxX = (CopyAttribs->DstX + SrcRegion->MaxX) - SrcRegion->MinX;
      DstBox.MinX = CopyAttribs->DstX;
      DstBox.MaxY = (CopyAttribs->DstY + SrcRegion->MaxY) - SrcRegion->MinY;
      DstBox.MinY = CopyAttribs->DstY;
      DstBox.MaxZ = (CopyAttribs->DstZ + SrcRegion->MaxZ) - SrcRegion->MinZ;
      DstBox.MinZ = CopyAttribs->DstZ;
      CopyBufferToTexture(this,(pTexture->m_StagingBuffer).m_VkObject,UVar6,
                          MipLevelAttribs.StorageWidth,pTexture_00,&DstBox,CopyAttribs->DstMipLevel,
                          CopyAttribs->DstSlice,CopyAttribs->DstTextureTransitionMode);
    }
    else if (UVar3 == USAGE_STAGING && UVar2 != USAGE_STAGING) {
      if (((pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_Desc.CPUAccessFlags & CPU_ACCESS_READ) == CPU_ACCESS_NONE) {
        FormatString<char[85]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [85])
                   "Attempting to copy to staging texture that was not created with CPU_ACCESS_READ flag"
                  );
        DebugAssertionFailed
                  ((Char *)MipLevelAttribs._0_8_,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x98c);
        if ((Uint32 *)MipLevelAttribs._0_8_ != &MipLevelAttribs.Depth) {
          operator_delete((void *)MipLevelAttribs._0_8_,MipLevelAttribs._16_8_ + 1);
        }
      }
      if ((pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).m_State !=
          RESOURCE_STATE_COPY_DEST) {
        FormatString<char[82]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [82])
                   "Destination staging texture must permanently be in RESOURCE_STATE_COPY_DEST state"
                  );
        DebugAssertionFailed
                  ((Char *)MipLevelAttribs._0_8_,"CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x98d);
        if ((Uint32 *)MipLevelAttribs._0_8_ != &MipLevelAttribs.Depth) {
          operator_delete((void *)MipLevelAttribs._0_8_,MipLevelAttribs._16_8_ + 1);
        }
      }
      pTVar1 = &(pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc;
      UVar6 = GetStagingTextureLocationOffset
                        (pTVar1,CopyAttribs->DstSlice,CopyAttribs->DstMipLevel,0x10,
                         CopyAttribs->DstX,CopyAttribs->DstY,CopyAttribs->DstZ);
      GetMipLevelProperties(&MipLevelAttribs,pTVar1,CopyAttribs->DstMipLevel);
      CopyTextureToBuffer(this,pTexture,SrcRegion,CopyAttribs->SrcMipLevel,CopyAttribs->SrcSlice,
                          CopyAttribs->SrcTextureTransitionMode,
                          (pTexture_00->m_StagingBuffer).m_VkObject,UVar6,
                          MipLevelAttribs.StorageWidth);
    }
    else {
      FormatString<char[100]>
                ((string *)&MipLevelAttribs,
                 (char (*) [100])
                 "Copying data between staging textures is not supported and is likely not want you really want to do"
                );
      DebugAssertionFailed
                ((Char *)MipLevelAttribs._0_8_,"CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x9a3);
      if ((Uint32 *)MipLevelAttribs._0_8_ != &MipLevelAttribs.Depth) {
        operator_delete((void *)MipLevelAttribs._0_8_,MipLevelAttribs._16_8_ + 1);
      }
    }
  }
  else {
    MipLevelAttribs.DepthSliceSize = 0;
    MipLevelAttribs.MipSize = 0;
    MipLevelAttribs.LogicalWidth = 0;
    MipLevelAttribs.LogicalHeight = 0;
    MipLevelAttribs.StorageWidth = 0;
    MipLevelAttribs.StorageHeight = 0;
    MipLevelAttribs._20_4_ = SrcRegion->MinY;
    MipLevelAttribs.Depth = SrcRegion->MinX;
    MipLevelAttribs.RowSize = (Uint64)SrcRegion->MinZ;
    pTVar7 = GetTextureFormatAttribs
                       ((pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    VVar4 = ComponentTypeToVkAspectMask(pTVar7->ComponentType);
    pTVar7 = GetTextureFormatAttribs
                       ((pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    VVar5 = ComponentTypeToVkAspectMask(pTVar7->ComponentType);
    if (VVar4 != VVar5) {
      FormatString<char[62]>
                ((string *)&DstBox,
                 (char (*) [62])"Vulkan spec requires that dst and src aspect masks must match");
      DebugAssertionFailed
                ((Char *)DstBox._0_8_,"CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x954);
      if ((Uint32 *)DstBox._0_8_ != &DstBox.MinZ) {
        operator_delete((void *)DstBox._0_8_,DstBox._16_8_ + 1);
      }
    }
    MipLevelAttribs.StorageHeight = 1;
    MipLevelAttribs.StorageWidth = CopyAttribs->SrcSlice;
    MipLevelAttribs.LogicalHeight = CopyAttribs->SrcMipLevel;
    MipLevelAttribs.LogicalWidth = VVar4;
    MipLevelAttribs.DepthSliceSize._0_4_ = CopyAttribs->DstMipLevel;
    MipLevelAttribs.DepthSliceSize._4_4_ = CopyAttribs->DstSlice;
    MipLevelAttribs.RowSize = CONCAT44(VVar4,(undefined4)MipLevelAttribs.RowSize);
    MipLevelAttribs.MipSize = CONCAT44(CopyAttribs->DstX,1);
    CopyTextureRegion(this,pTexture,CopyAttribs->SrcTextureTransitionMode,pTexture_00,
                      CopyAttribs->DstTextureTransitionMode,(VkImageCopy *)&MipLevelAttribs);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CopyTexture(const CopyTextureAttribs& CopyAttribs)
{
    TDeviceContextBase::CopyTexture(CopyAttribs);

    TextureVkImpl* pSrcTexVk = ClassPtrCast<TextureVkImpl>(CopyAttribs.pSrcTexture);
    TextureVkImpl* pDstTexVk = ClassPtrCast<TextureVkImpl>(CopyAttribs.pDstTexture);

    // We must unbind the textures from framebuffer because
    // we will transition their states. If we later try to commit
    // them as render targets (e.g. from SetPipelineState()), a
    // state mismatch error will occur.
    UnbindTextureFromFramebuffer(pSrcTexVk, true);
    UnbindTextureFromFramebuffer(pDstTexVk, true);

    const TextureDesc& SrcTexDesc = pSrcTexVk->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexVk->GetDesc();
    const Box*         pSrcBox    = CopyAttribs.pSrcBox;
    Box                FullMipBox;
    if (pSrcBox == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        FullMipBox.MaxX = MipLevelAttribs.LogicalWidth;
        FullMipBox.MaxY = MipLevelAttribs.LogicalHeight;
        FullMipBox.MaxZ = MipLevelAttribs.Depth;
        pSrcBox         = &FullMipBox;
    }

    if (SrcTexDesc.Usage != USAGE_STAGING && DstTexDesc.Usage != USAGE_STAGING)
    {
        VkImageCopy CopyRegion = {};

        CopyRegion.srcOffset.x   = pSrcBox->MinX;
        CopyRegion.srcOffset.y   = pSrcBox->MinY;
        CopyRegion.srcOffset.z   = pSrcBox->MinZ;
        CopyRegion.extent.width  = pSrcBox->Width();
        CopyRegion.extent.height = std::max(pSrcBox->Height(), 1u);
        CopyRegion.extent.depth  = std::max(pSrcBox->Depth(), 1u);

        auto GetAspectMak = [](TEXTURE_FORMAT Format) -> VkImageAspectFlags {
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Format);
            return ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);
        };
        VkImageAspectFlags aspectMask = GetAspectMak(SrcTexDesc.Format);
        DEV_CHECK_ERR(aspectMask == GetAspectMak(DstTexDesc.Format), "Vulkan spec requires that dst and src aspect masks must match");

        CopyRegion.srcSubresource.baseArrayLayer = CopyAttribs.SrcSlice;
        CopyRegion.srcSubresource.layerCount     = 1;
        CopyRegion.srcSubresource.mipLevel       = CopyAttribs.SrcMipLevel;
        CopyRegion.srcSubresource.aspectMask     = aspectMask;

        CopyRegion.dstSubresource.baseArrayLayer = CopyAttribs.DstSlice;
        CopyRegion.dstSubresource.layerCount     = 1;
        CopyRegion.dstSubresource.mipLevel       = CopyAttribs.DstMipLevel;
        CopyRegion.dstSubresource.aspectMask     = aspectMask;

        CopyRegion.dstOffset.x = CopyAttribs.DstX;
        CopyRegion.dstOffset.y = CopyAttribs.DstY;
        CopyRegion.dstOffset.z = CopyAttribs.DstZ;

        CopyTextureRegion(pSrcTexVk, CopyAttribs.SrcTextureTransitionMode, pDstTexVk, CopyAttribs.DstTextureTransitionMode, CopyRegion);
    }
    else if (SrcTexDesc.Usage == USAGE_STAGING && DstTexDesc.Usage != USAGE_STAGING)
    {
        DEV_CHECK_ERR((SrcTexDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Attempting to copy from staging texture that was not created with CPU_ACCESS_WRITE flag");
        DEV_CHECK_ERR(pSrcTexVk->GetState() == RESOURCE_STATE_COPY_SOURCE, "Source staging texture must permanently be in RESOURCE_STATE_COPY_SOURCE state");

        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)

        // bufferOffset must be a multiple of 4 (18.4)
        // If the calling command's VkImage parameter is a compressed image, bufferOffset
        // must be a multiple of the compressed texel block size in bytes (18.4). This
        // is automatically guaranteed as MipWidth and MipHeight are rounded to block size.

        const Uint64 SrcBufferOffset =
            GetStagingTextureLocationOffset(SrcTexDesc, CopyAttribs.SrcSlice, CopyAttribs.SrcMipLevel,
                                            TextureVkImpl::StagingBufferOffsetAlignment,
                                            pSrcBox->MinX, pSrcBox->MinY, pSrcBox->MinZ);
        const MipLevelProperties SrcMipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        Box DstBox;
        DstBox.MinX = CopyAttribs.DstX;
        DstBox.MinY = CopyAttribs.DstY;
        DstBox.MinZ = CopyAttribs.DstZ;
        DstBox.MaxX = DstBox.MinX + pSrcBox->Width();
        DstBox.MaxY = DstBox.MinY + pSrcBox->Height();
        DstBox.MaxZ = DstBox.MinZ + pSrcBox->Depth();

        CopyBufferToTexture(
            pSrcTexVk->GetVkStagingBuffer(),
            SrcBufferOffset,
            SrcMipLevelAttribs.StorageWidth, // GetStagingTextureLocationOffset assumes texels are tightly packed
            *pDstTexVk,
            DstBox,
            CopyAttribs.DstMipLevel,
            CopyAttribs.DstSlice,
            CopyAttribs.DstTextureTransitionMode);
    }
    else if (SrcTexDesc.Usage != USAGE_STAGING && DstTexDesc.Usage == USAGE_STAGING)
    {
        DEV_CHECK_ERR((DstTexDesc.CPUAccessFlags & CPU_ACCESS_READ), "Attempting to copy to staging texture that was not created with CPU_ACCESS_READ flag");
        DEV_CHECK_ERR(pDstTexVk->GetState() == RESOURCE_STATE_COPY_DEST, "Destination staging texture must permanently be in RESOURCE_STATE_COPY_DEST state");

        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
        const Uint64 DstBufferOffset =
            GetStagingTextureLocationOffset(DstTexDesc, CopyAttribs.DstSlice, CopyAttribs.DstMipLevel,
                                            TextureVkImpl::StagingBufferOffsetAlignment,
                                            CopyAttribs.DstX, CopyAttribs.DstY, CopyAttribs.DstZ);
        const MipLevelProperties DstMipLevelAttribs = GetMipLevelProperties(DstTexDesc, CopyAttribs.DstMipLevel);

        CopyTextureToBuffer(
            *pSrcTexVk,
            *pSrcBox,
            CopyAttribs.SrcMipLevel,
            CopyAttribs.SrcSlice,
            CopyAttribs.SrcTextureTransitionMode,
            pDstTexVk->GetVkStagingBuffer(),
            DstBufferOffset,
            DstMipLevelAttribs.StorageWidth // GetStagingTextureLocationOffset assumes texels are tightly packed
        );
    }
    else
    {
        UNSUPPORTED("Copying data between staging textures is not supported and is likely not want you really want to do");
    }
}